

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O2

int __thiscall
cmCTestCoverageHandler::HandleTracePyCoverage
          (cmCTestCoverageHandler *this,cmCTestCoverageHandlerContainer *cont)

{
  ulong uVar1;
  cmCTest *pcVar2;
  pointer piVar3;
  bool bVar4;
  int iVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  ostream *poVar6;
  mapped_type *this_00;
  int iVar7;
  pointer fileName_00;
  long lVar8;
  int iVar9;
  cmCTestCoverageHandler *this_01;
  ulong uVar10;
  string nl;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string actualSourceFile;
  string fileName;
  _Base_ptr local_488 [4];
  string tempDir;
  string testingDir;
  string daGlob;
  Glob gl;
  ostringstream cmCTestLog_msg_4;
  undefined4 uStack_3ac;
  ostringstream cmCTestLog_msg;
  byte abStack_218 [488];
  
  cmsys::Glob::Glob(&gl);
  gl.Recurse = true;
  gl.RecurseThroughSymlinks = false;
  std::operator+(&daGlob,&cont->BinaryDir,"/*.cover");
  cmsys::Glob::FindFiles(&gl,&daGlob,(GlobMessages *)0x0);
  __x = cmsys::Glob::GetFiles_abi_cxx11_(&gl);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&files,__x);
  if (files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,
                             " Cannot find any Python Trace.py coverage files.");
    std::endl<char,std::char_traits<char>>(poVar6);
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x63c,(char *)CONCAT44(uStack_3ac,_cmCTestLog_msg_4),
                 (this->super_cmCTestGenericHandler).Quiet);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg_4);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    iVar9 = 0;
  }
  else {
    cmCTest::GetBinaryDir_abi_cxx11_
              ((string *)&cmCTestLog_msg,(this->super_cmCTestGenericHandler).CTest);
    std::operator+(&testingDir,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCTestLog_msg,"/Testing");
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    std::operator+(&tempDir,&testingDir,"/CoverageInfo");
    iVar9 = 0;
    this_01 = (cmCTestCoverageHandler *)0x0;
    cmsys::SystemTools::MakeDirectory(&tempDir,(mode_t *)0x0);
    for (fileName_00 = files.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        fileName_00 !=
        files.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; fileName_00 = fileName_00 + 1) {
      FindFile(&fileName,this_01,cont,fileName_00);
      if (fileName._M_string_length == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,
                                 "Cannot find source Python file corresponding to: ");
        poVar6 = std::operator<<(poVar6,(string *)fileName_00);
        std::endl<char,std::char_traits<char>>(poVar6);
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        this_01 = (cmCTestCoverageHandler *)0x7;
        cmCTest::Log(pcVar2,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x64b,(char *)CONCAT44(uStack_3ac,_cmCTestLog_msg_4),false);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_4);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      }
      else {
        cmsys::SystemTools::CollapseFullPath(&actualSourceFile,&fileName);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,"   Check coverage for file: ");
        poVar6 = std::operator<<(poVar6,(string *)&actualSourceFile);
        std::endl<char,std::char_traits<char>>(poVar6);
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x653,(char *)CONCAT44(uStack_3ac,_cmCTestLog_msg_4),
                     (this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_4);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        this_00 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ::operator[](&cont->TotalCoverage,&actualSourceFile);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,"   in file: ");
        poVar6 = std::operator<<(poVar6,(string *)fileName_00);
        std::endl<char,std::char_traits<char>>(poVar6);
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x657,(char *)CONCAT44(uStack_3ac,_cmCTestLog_msg_4),
                     (this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_4);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        std::ifstream::ifstream((istream *)&cmCTestLog_msg,(fileName_00->_M_dataplus)._M_p,_S_in);
        if ((abStack_218[*(long *)(_cmCTestLog_msg + -0x18)] & 5) == 0) {
          nl._M_dataplus._M_p = (pointer)&nl.field_2;
          nl._M_string_length = 0;
          nl.field_2._M_local_buf[0] = '\0';
          uVar1 = 0xffffffffffffffff;
          while( true ) {
            uVar10 = uVar1;
            this_01 = (cmCTestCoverageHandler *)&nl;
            bVar4 = cmsys::SystemTools::GetLineFromStream
                              ((istream *)&cmCTestLog_msg,(string *)this_01,(bool *)0x0,
                               0xffffffffffffffff);
            if (!bVar4) break;
            uVar1 = uVar10 + 1;
            if (0xb < nl._M_string_length) {
              for (lVar8 = 4; lVar8 != 7; lVar8 = lVar8 + 1) {
                if (nl._M_dataplus._M_p[lVar8 + 1] == ' ') goto LAB_00235040;
                if (nl._M_dataplus._M_p[lVar8 + 1] == ':') {
                  std::__cxx11::string::substr((ulong)&cmCTestLog_msg_4,(ulong)&nl);
                  iVar5 = atoi((char *)CONCAT44(uStack_3ac,_cmCTestLog_msg_4));
                  std::__cxx11::string::~string((string *)&cmCTestLog_msg_4);
                  goto LAB_0023506c;
                }
              }
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_4);
              poVar6 = std::operator<<((ostream *)&cmCTestLog_msg_4,
                                       "Currently the limit is maximum coverage of 999999");
              std::endl<char,std::char_traits<char>>(poVar6);
              pcVar2 = (this->super_cmCTestGenericHandler).CTest;
              std::__cxx11::stringbuf::str();
              cmCTest::Log(pcVar2,7,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                           ,0x680,(char *)local_488[0],false);
              std::__cxx11::string::~string((string *)local_488);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_4);
LAB_00235040:
              iVar5 = 0;
LAB_0023506c:
              while (piVar3 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start,
                    (ulong)((long)(this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_finish - (long)piVar3 >> 2) <= uVar1) {
                _cmCTestLog_msg_4 = 0xffffffff;
                std::vector<int,_std::allocator<int>_>::emplace_back<int>
                          (this_00,(int *)&cmCTestLog_msg_4);
              }
              iVar7 = piVar3[uVar10 + 1];
              if (-1 < iVar5 && iVar7 < 0) {
                piVar3[uVar10 + 1] = 0;
                iVar7 = 0;
              }
              piVar3[uVar10 + 1] = iVar7 + iVar5;
            }
          }
          std::__cxx11::string::~string((string *)&nl);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_4);
          poVar6 = std::operator<<((ostream *)&cmCTestLog_msg_4,"Cannot open file: ");
          poVar6 = std::operator<<(poVar6,(string *)fileName_00);
          std::endl<char,std::char_traits<char>>(poVar6);
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          this_01 = (cmCTestCoverageHandler *)0x7;
          cmCTest::Log(pcVar2,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x65b,nl._M_dataplus._M_p,false);
          std::__cxx11::string::~string((string *)&nl);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_4);
        }
        iVar9 = iVar9 + 1;
        std::ifstream::~ifstream((istream *)&cmCTestLog_msg);
        std::__cxx11::string::~string((string *)&actualSourceFile);
      }
      std::__cxx11::string::~string((string *)&fileName);
    }
    std::__cxx11::string::~string((string *)&tempDir);
    std::__cxx11::string::~string((string *)&testingDir);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&files);
  std::__cxx11::string::~string((string *)&daGlob);
  cmsys::Glob::~Glob(&gl);
  return iVar9;
}

Assistant:

int cmCTestCoverageHandler::HandleTracePyCoverage(
  cmCTestCoverageHandlerContainer* cont)
{
  cmsys::Glob gl;
  gl.RecurseOn();
  gl.RecurseThroughSymlinksOff();
  std::string daGlob = cont->BinaryDir + "/*.cover";
  gl.FindFiles(daGlob);
  std::vector<std::string> files = gl.GetFiles();

  if (files.empty()) {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       " Cannot find any Python Trace.py coverage files."
                         << std::endl,
                       this->Quiet);
    // No coverage files is a valid thing, so the exit code is 0
    return 0;
  }

  std::string testingDir = this->CTest->GetBinaryDir() + "/Testing";
  std::string tempDir = testingDir + "/CoverageInfo";
  cmSystemTools::MakeDirectory(tempDir);

  int file_count = 0;
  for (std::string const& file : files) {
    std::string fileName = this->FindFile(cont, file);
    if (fileName.empty()) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Cannot find source Python file corresponding to: "
                   << file << std::endl);
      continue;
    }

    std::string actualSourceFile = cmSystemTools::CollapseFullPath(fileName);
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "   Check coverage for file: " << actualSourceFile
                                                      << std::endl,
                       this->Quiet);
    cmCTestCoverageHandlerContainer::SingleFileCoverageVector* vec =
      &cont->TotalCoverage[actualSourceFile];
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "   in file: " << file << std::endl, this->Quiet);
    cmsys::ifstream ifile(file.c_str());
    if (!ifile) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Cannot open file: " << file << std::endl);
    } else {
      long cnt = -1;
      std::string nl;
      while (cmSystemTools::GetLineFromStream(ifile, nl)) {
        cnt++;

        // Skip empty lines
        if (nl.empty()) {
          continue;
        }

        // Skip unused lines
        if (nl.size() < 12) {
          continue;
        }

        // Read the coverage count from the beginning of the Trace.py output
        // line
        std::string::size_type pos;
        int cov = 0;
        // This is a hack. We should really do something more elaborate
        for (pos = 5; pos < 8; pos++) {
          if (nl[pos] == ' ') {
            // This line does not have ':' so no coverage here. That said,
            // Trace.py does not handle not covered lines versus comments etc.
            // So, this will be set to 0.
            break;
          }
          if (nl[pos] == ':') {
            cov = atoi(nl.substr(0, pos - 1).c_str());
            break;
          }
        }
        if (pos == 8) {
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "Currently the limit is maximum coverage of 999999"
                       << std::endl);
        }
        // Read the line number starting at the 10th character of the gcov
        // output line
        long lineIdx = cnt;
        if (lineIdx >= 0) {
          while (vec->size() <= static_cast<size_t>(lineIdx)) {
            vec->push_back(-1);
          }
          // Initially all entries are -1 (not used). If we get coverage
          // information, increment it to 0 first.
          if ((*vec)[lineIdx] < 0) {
            if (cov >= 0) {
              (*vec)[lineIdx] = 0;
            }
          }
          (*vec)[lineIdx] += cov;
        }
      }
    }
    ++file_count;
  }
  return file_count;
}